

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core_sse2.cc
# Opt level: O2

void webrtc::OverdriveAndSuppressSSE2(AecCore *aec,float *hNl,float hNlFb,float (*efw) [65])

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  uint uVar9;
  float fVar10;
  uint uVar12;
  float fVar13;
  uint uVar14;
  float fVar15;
  uint uVar16;
  undefined1 auVar11 [16];
  float fVar17;
  float fVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  auVar7 = _DAT_001a6690;
  auVar6 = _DAT_001a6680;
  fVar18 = aec->overDriveSm;
  for (lVar8 = 0; lVar8 + 3U < 0x41; lVar8 = lVar8 + 4) {
    pfVar1 = hNl + lVar8;
    fVar10 = *pfVar1;
    fVar13 = pfVar1[1];
    fVar15 = pfVar1[2];
    fVar17 = pfVar1[3];
    uVar9 = ~-(uint)(hNlFb < fVar10) & (uint)fVar10 |
            (uint)((1.0 - (float)(&WebRtcAec_weightCurve)[lVar8]) * fVar10 +
                  hNlFb * (float)(&WebRtcAec_weightCurve)[lVar8]) & -(uint)(hNlFb < fVar10);
    uVar12 = ~-(uint)(hNlFb < fVar13) & (uint)fVar13 |
             (uint)((1.0 - (float)(&DAT_001a5f14)[lVar8]) * fVar13 +
                   hNlFb * (float)(&DAT_001a5f14)[lVar8]) & -(uint)(hNlFb < fVar13);
    uVar14 = ~-(uint)(hNlFb < fVar15) & (uint)fVar15 |
             (uint)((1.0 - *(float *)(&UNK_001a5f18 + lVar8 * 4)) * fVar15 +
                   hNlFb * *(float *)(&UNK_001a5f18 + lVar8 * 4)) & -(uint)(hNlFb < fVar15);
    uVar16 = ~-(uint)(hNlFb < fVar17) & (uint)fVar17 |
             (uint)((1.0 - *(float *)(&UNK_001a5f1c + lVar8 * 4)) * fVar17 +
                   hNlFb * *(float *)(&UNK_001a5f1c + lVar8 * 4)) & -(uint)(hNlFb < fVar17);
    fVar10 = (float)(uVar9 & 0x7fffff | 0x3f800000);
    fVar13 = (float)(uVar12 & 0x7fffff | 0x3f800000);
    fVar15 = (float)(uVar14 & 0x7fffff | 0x3f800000);
    fVar17 = (float)(uVar16 & 0x7fffff | 0x3f800000);
    auVar11._0_4_ =
         ((fVar10 + -1.0) *
          (((((fVar10 * -0.034436006 + 0.31821337) * fVar10 + -1.2315303) * fVar10 + 2.5988452) *
            fVar10 + -3.324199) * fVar10 + 3.11579) +
         (float)(uVar9 >> 8 & 0x7f8000 | 0x43800000) + -383.0) *
         (float)(&WebRtcAec_overDriveCurve)[lVar8] * fVar18;
    auVar11._4_4_ =
         ((fVar13 + -1.0) *
          (((((fVar13 * -0.034436006 + 0.31821337) * fVar13 + -1.2315303) * fVar13 + 2.5988452) *
            fVar13 + -3.324199) * fVar13 + 3.11579) +
         (float)(uVar12 >> 8 & 0x7f8000 | 0x43800000) + -383.0) *
         (float)(&DAT_001a6024)[lVar8] * fVar18;
    auVar11._8_4_ =
         ((fVar15 + -1.0) *
          (((((fVar15 * -0.034436006 + 0.31821337) * fVar15 + -1.2315303) * fVar15 + 2.5988452) *
            fVar15 + -3.324199) * fVar15 + 3.11579) +
         (float)(uVar14 >> 8 & 0x7f8000 | 0x43800000) + -383.0) *
         *(float *)(&UNK_001a6028 + lVar8 * 4) * fVar18;
    auVar11._12_4_ =
         ((fVar17 + -1.0) *
          (((((fVar17 * -0.034436006 + 0.31821337) * fVar17 + -1.2315303) * fVar17 + 2.5988452) *
            fVar17 + -3.324199) * fVar17 + 3.11579) +
         (float)(uVar16 >> 8 & 0x7f8000 | 0x43800000) + -383.0) *
         *(float *)(&UNK_001a602c + lVar8 * 4) * fVar18;
    auVar11 = minps(auVar11,auVar6);
    auVar11 = maxps(auVar11,auVar7);
    iVar19 = (int)(auVar11._0_4_ + -0.5);
    iVar20 = (int)(auVar11._4_4_ + -0.5);
    iVar21 = (int)(auVar11._8_4_ + -0.5);
    iVar22 = (int)(auVar11._12_4_ + -0.5);
    fVar10 = auVar11._0_4_ - (float)iVar19;
    fVar13 = auVar11._4_4_ - (float)iVar20;
    fVar15 = auVar11._8_4_ - (float)iVar21;
    fVar17 = auVar11._12_4_ - (float)iVar22;
    fVar23 = ((fVar10 * 0.33718944 + 0.6576363) * fVar10 + 1.0017247) *
             (float)(iVar19 * 0x800000 + 0x3f800000);
    fVar24 = ((fVar13 * 0.33718944 + 0.6576363) * fVar13 + 1.0017247) *
             (float)(iVar20 * 0x800000 + 0x3f800000);
    fVar25 = ((fVar15 * 0.33718944 + 0.6576363) * fVar15 + 1.0017247) *
             (float)(iVar21 * 0x800000 + 0x3f800000);
    fVar26 = ((fVar17 * 0.33718944 + 0.6576363) * fVar17 + 1.0017247) *
             (float)(iVar22 * 0x800000 + 0x3f800000);
    pfVar1 = hNl + lVar8;
    *pfVar1 = fVar23;
    pfVar1[1] = fVar24;
    pfVar1[2] = fVar25;
    pfVar1[3] = fVar26;
    pfVar1 = *efw + lVar8;
    fVar10 = pfVar1[1];
    fVar13 = pfVar1[2];
    fVar15 = pfVar1[3];
    pfVar2 = efw[1] + lVar8;
    fVar17 = *pfVar2;
    fVar3 = pfVar2[1];
    fVar4 = pfVar2[2];
    fVar5 = pfVar2[3];
    pfVar2 = *efw + lVar8;
    *pfVar2 = *pfVar1 * fVar23;
    pfVar2[1] = fVar10 * fVar24;
    pfVar2[2] = fVar13 * fVar25;
    pfVar2[3] = fVar15 * fVar26;
    pfVar1 = efw[1] + lVar8;
    *pfVar1 = -fVar17 * fVar23;
    pfVar1[1] = -fVar3 * fVar24;
    pfVar1[2] = -fVar4 * fVar25;
    pfVar1[3] = -fVar5 * fVar26;
  }
  fVar18 = hNl[0x40];
  if (hNlFb < fVar18) {
    fVar18 = fVar18 * 0.6 + hNlFb * 0.4;
    hNl[0x40] = fVar18;
  }
  fVar18 = powf(fVar18,aec->overDriveSm * 2.0);
  hNl[0x40] = fVar18;
  (*efw)[0x40] = fVar18 * (*efw)[0x40];
  efw[1][0x40] = -efw[1][0x40] * hNl[0x40];
  return;
}

Assistant:

static void OverdriveAndSuppressSSE2(AecCore* aec,
                                     float hNl[PART_LEN1],
                                     const float hNlFb,
                                     float efw[2][PART_LEN1]) {
  int i;
  const __m128 vec_hNlFb = _mm_set1_ps(hNlFb);
  const __m128 vec_one = _mm_set1_ps(1.0f);
  const __m128 vec_minus_one = _mm_set1_ps(-1.0f);
  const __m128 vec_overDriveSm = _mm_set1_ps(aec->overDriveSm);
  // vectorized code (four at once)
  for (i = 0; i + 3 < PART_LEN1; i += 4) {
    // Weight subbands
    __m128 vec_hNl = _mm_loadu_ps(&hNl[i]);
    const __m128 vec_weightCurve = _mm_loadu_ps(&WebRtcAec_weightCurve[i]);
    const __m128 bigger = _mm_cmpgt_ps(vec_hNl, vec_hNlFb);
    const __m128 vec_weightCurve_hNlFb = _mm_mul_ps(vec_weightCurve, vec_hNlFb);
    const __m128 vec_one_weightCurve = _mm_sub_ps(vec_one, vec_weightCurve);
    const __m128 vec_one_weightCurve_hNl =
        _mm_mul_ps(vec_one_weightCurve, vec_hNl);
    const __m128 vec_if0 = _mm_andnot_ps(bigger, vec_hNl);
    const __m128 vec_if1 = _mm_and_ps(
        bigger, _mm_add_ps(vec_weightCurve_hNlFb, vec_one_weightCurve_hNl));
    vec_hNl = _mm_or_ps(vec_if0, vec_if1);

    {
      const __m128 vec_overDriveCurve =
          _mm_loadu_ps(&WebRtcAec_overDriveCurve[i]);
      const __m128 vec_overDriveSm_overDriveCurve =
          _mm_mul_ps(vec_overDriveSm, vec_overDriveCurve);
      vec_hNl = mm_pow_ps(vec_hNl, vec_overDriveSm_overDriveCurve);
      _mm_storeu_ps(&hNl[i], vec_hNl);
    }

    // Suppress error signal
    {
      __m128 vec_efw_re = _mm_loadu_ps(&efw[0][i]);
      __m128 vec_efw_im = _mm_loadu_ps(&efw[1][i]);
      vec_efw_re = _mm_mul_ps(vec_efw_re, vec_hNl);
      vec_efw_im = _mm_mul_ps(vec_efw_im, vec_hNl);

      // Ooura fft returns incorrect sign on imaginary component. It matters
      // here because we are making an additive change with comfort noise.
      vec_efw_im = _mm_mul_ps(vec_efw_im, vec_minus_one);
      _mm_storeu_ps(&efw[0][i], vec_efw_re);
      _mm_storeu_ps(&efw[1][i], vec_efw_im);
    }
  }
  // scalar code for the remaining items.
  for (; i < PART_LEN1; i++) {
    // Weight subbands
    if (hNl[i] > hNlFb) {
      hNl[i] = WebRtcAec_weightCurve[i] * hNlFb +
               (1 - WebRtcAec_weightCurve[i]) * hNl[i];
    }
    hNl[i] = powf(hNl[i], aec->overDriveSm * WebRtcAec_overDriveCurve[i]);

    // Suppress error signal
    efw[0][i] *= hNl[i];
    efw[1][i] *= hNl[i];

    // Ooura fft returns incorrect sign on imaginary component. It matters
    // here because we are making an additive change with comfort noise.
    efw[1][i] *= -1;
  }
}